

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O2

bool tinyusdz::anon_unknown_27::ParseUSDZHeader
               (uint8_t *addr,size_t length,
               vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
               *assets,string *warn,string *err)

{
  pointer *ppUVar1;
  ushort uVar2;
  uint uVar3;
  pointer __first;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  ulong uVar8;
  pointer __result;
  pointer pUVar9;
  pointer pUVar10;
  long lVar11;
  _Tp_alloc_type *__alloc;
  _Tp_alloc_type *p_Var12;
  bool bVar13;
  ulong uVar14;
  vector<char,_std::allocator<char>_> local_header;
  USDZAssetInfo info;
  string varname;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((addr == (uint8_t *)0x0) || (length < 0x76)) {
    if (warn != (string *)0x0) {
      ::std::__cxx11::string::append((char *)warn);
    }
LAB_0011f1e0:
    bVar13 = false;
  }
  else {
    lVar11 = 0;
    while( true ) {
      uVar8 = lVar11 + 0x1e;
      bVar13 = true;
      if (length <= uVar8) break;
      std::vector<char,_std::allocator<char>_>::vector(&local_header,0x1e,(allocator_type *)&info);
      uVar4 = *(undefined8 *)(addr + lVar11 + 8);
      uVar5 = *(undefined8 *)(addr + lVar11 + 0xe);
      uVar6 = *(undefined8 *)(addr + lVar11 + 0xe + 8);
      *(undefined8 *)
       local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_start = *(undefined8 *)(addr + lVar11);
      *(undefined8 *)
       (local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
        ._M_start + 8) = uVar4;
      *(undefined8 *)
       (local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
        ._M_start + 0xe) = uVar5;
      *(undefined8 *)
       (local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
        ._M_start + 0x16) = uVar6;
      if ((((*local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != 'P') ||
           (local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[1] != 'K')) ||
          (local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start[2] != '\x03')) ||
         (local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start[3] != '\x04')) {
        if (lVar11 != 0) {
          std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                    (&local_header.super__Vector_base<char,_std::allocator<char>_>);
          return true;
        }
joined_r0x0011f0ff:
        if (warn != (string *)0x0) {
          ::std::__cxx11::string::append((char *)warn);
        }
LAB_0011f1d6:
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  (&local_header.super__Vector_base<char,_std::allocator<char>_>);
        goto LAB_0011f1e0;
      }
      uVar2 = *(ushort *)
               (local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start + 0x1a);
      uVar14 = uVar8 + uVar2;
      if (length < uVar14) goto joined_r0x0011f0ff;
      varname._M_dataplus._M_p = (pointer)&varname.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&varname,(char)uVar2);
      memcpy(varname._M_dataplus._M_p,addr + uVar8,(ulong)uVar2);
      uVar14 = uVar14 + *(ushort *)
                         (local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start + 0x1c);
      if (length < uVar14) {
joined_r0x0011f133:
        if (warn != (string *)0x0) {
          ::std::__cxx11::string::append((char *)warn);
        }
LAB_0011f1cc:
        ::std::__cxx11::string::_M_dispose();
        goto LAB_0011f1d6;
      }
      if ((uVar14 & 0x3f) != 0) {
        if (warn != (string *)0x0) {
          std::__cxx11::to_string(&local_70,uVar14);
          ::std::operator+(&local_50,"Data offset must be mulitple of 64bytes for USDZ, but got ",
                           &local_70);
          ::std::operator+(&info.filename,&local_50,".\n");
          ::std::__cxx11::string::append((string *)warn);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        goto LAB_0011f1cc;
      }
      if (*(short *)(local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start + 8) != 0) goto joined_r0x0011f133;
      uVar3 = *(uint *)(local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start + 0x16);
      if (assets != (vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                     *)0x0) {
        info.filename._M_string_length = 0;
        info.filename.field_2._M_local_buf[0] = '\0';
        info.filename._M_dataplus._M_p = (pointer)&info.filename.field_2;
        ::std::__cxx11::string::_M_assign((string *)&info);
        info.byte_end = uVar3 + uVar14;
        pUVar10 = (assets->
                  super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        info.byte_begin = uVar14;
        if (pUVar10 ==
            (assets->
            super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          __first = (assets->
                    super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if ((long)pUVar10 - (long)__first == 0x7fffffffffffffe0) {
            ::std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar7 = ((long)pUVar10 - (long)__first) / 0x30;
          uVar8 = uVar7;
          if (pUVar10 == __first) {
            uVar8 = 1;
          }
          __alloc = (_Tp_alloc_type *)(uVar8 + uVar7);
          if ((_Tp_alloc_type *)0x2aaaaaaaaaaaaa9 < __alloc) {
            __alloc = (_Tp_alloc_type *)0x2aaaaaaaaaaaaaa;
          }
          p_Var12 = (_Tp_alloc_type *)0x2aaaaaaaaaaaaaa;
          if (!CARRY8(uVar8,uVar7)) {
            p_Var12 = __alloc;
          }
          if (p_Var12 == (_Tp_alloc_type *)0x0) {
            __result = (pointer)0x0;
          }
          else {
            __result = (pointer)operator_new((long)p_Var12 * 0x30);
          }
          ::std::__cxx11::string::string((string *)(__result + uVar7),(string *)&info);
          __result[uVar7].byte_begin = info.byte_begin;
          (&__result[uVar7].byte_begin)[1] = info.byte_end;
          pUVar9 = std::
                   vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                   ::_S_relocate(__first,pUVar10,__result,__alloc);
          pUVar10 = std::
                    vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                    ::_S_relocate(pUVar10,pUVar10,pUVar9 + 1,__alloc);
          lVar11 = (long)(assets->
                         super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                         )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__first;
          std::
          _Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
          ::_M_deallocate((_Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                           *)__first,(pointer)(lVar11 / 0x30),lVar11 % 0x30);
          (assets->
          super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
          )._M_impl.super__Vector_impl_data._M_start = __result;
          (assets->
          super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
          )._M_impl.super__Vector_impl_data._M_finish = pUVar10;
          (assets->
          super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)p_Var12;
        }
        else {
          ::std::__cxx11::string::string((string *)pUVar10,(string *)&info);
          pUVar10->byte_begin = info.byte_begin;
          pUVar10->byte_end = info.byte_end;
          ppUVar1 = &(assets->
                     super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppUVar1 = *ppUVar1 + 1;
        }
        ::std::__cxx11::string::_M_dispose();
      }
      lVar11 = uVar3 + uVar14;
      ::std::__cxx11::string::_M_dispose();
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&local_header.super__Vector_base<char,_std::allocator<char>_>);
    }
  }
  return bVar13;
}

Assistant:

bool ParseUSDZHeader(const uint8_t *addr, const size_t length,
                     std::vector<USDZAssetInfo> *assets, std::string *warn,
                     std::string *err) {
  (void)warn;

  if (!addr) {
    if (err) {
      (*err) += "null for `addr` argument.\n";
    }
    return false;
  }

  if (length < (11 * 8) + 30) {  // 88 for USDC header, 30 for ZIP header
    // ???
    if (err) {
      (*err) += "File size too short. Looks like this file is not a USDZ\n";
    }
    return false;
  }

  size_t offset = 0;
  while ((offset + 30) < length) {
    //
    // PK zip format:
    // https://users.cs.jmu.edu/buchhofp/forensics/formats/pkzip.html
    //
    std::vector<char> local_header(30);
    memcpy(local_header.data(), addr + offset, 30);

    // Check signagure(first 4 bytes)
    // Must be \x50\x4b\x03\x04
    if ((local_header[0] == 0x50) && (local_header[1] == 0x4b) &&
        (local_header[2] == 0x03) && (local_header[3] == 0x04)) {
      // ok

      // TODO: Check other header info(version, flags, crc32)
    } else {
      if (offset == 0) {
        // Invalid header found.
        if (err) {
          (*err) += "PKZIP header not found.\n";
        }
        return false;
      } else {
        // not a local(global?) header
        // Maybe near to the end of file.
        break;
      }
    }

    offset += 30;

    // read in the variable name
    uint16_t name_len;
    memcpy(&name_len, &local_header[26], sizeof(uint16_t));
    if ((offset + name_len) > length) {
      if (err) {
        (*err) += "Invalid ZIP data\n";
      }
      return false;
    }

    std::string varname(name_len, ' ');
    memcpy(&varname[0], addr + offset, name_len);

    offset += name_len;

    // read in the extra field
    uint16_t extra_field_len;
    memcpy(&extra_field_len, &local_header[28], sizeof(uint16_t));
    if (extra_field_len > 0) {
      if (offset + extra_field_len > length) {
        if (err) {
          (*err) += "Invalid extra field length in ZIP data\n";
        }
        return false;
      }
    }

    offset += extra_field_len;

    // In usdz, data must be aligned at 64bytes boundary.
    if ((offset % 64) != 0) {
      if (err) {
        (*err) += "Data offset must be mulitple of 64bytes for USDZ, but got " +
                  std::to_string(offset) + ".\n";
      }
      return false;
    }

    uint16_t compr_method = *reinterpret_cast<uint16_t *>(&local_header[0] + 8);
    // uint32_t compr_bytes = *reinterpret_cast<uint32_t*>(&local_header[0]+18);
    uint32_t uncompr_bytes;
    memcpy(&uncompr_bytes, &local_header[22], sizeof(uncompr_bytes));

    // USDZ only supports uncompressed ZIP
    if (compr_method != 0) {
      if (err) {
        (*err) += "Compressed ZIP is not supported for USDZ\n";
      }
      return false;
    }

    if (assets) {
      USDZAssetInfo info;
      DCOUT("USDZasset[" << assets->size() << "] " << varname << ", byte_begin " << offset << ", length " << uncompr_bytes << "\n");
      info.filename = varname;
      info.byte_begin = offset;
      info.byte_end = offset + uncompr_bytes;

      assets->push_back(info);
    }

    offset += uncompr_bytes;
  }

  return true;
}